

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldTypesTestCase.cpp
# Opt level: O0

void __thiscall
SuiteFieldTypesTests::TestDateTime_getFraction_NanoSecond::RunImpl
          (TestDateTime_getFraction_NanoSecond *this)

{
  TestResults *pTVar1;
  TestResults **ppTVar2;
  TestDetails **ppTVar3;
  TestDetails local_2e8;
  int local_2c8 [10];
  TestDetails local_2a0;
  int local_280 [10];
  TestDetails local_258;
  int local_238 [10];
  TestDetails local_210;
  int local_1f0 [10];
  TestDetails local_1c8;
  int local_1a8 [10];
  TestDetails local_180;
  int local_160 [10];
  TestDetails local_138;
  int local_118 [10];
  TestDetails local_f0;
  int local_d0 [10];
  TestDetails local_a8;
  int local_88 [10];
  TestDetails local_60;
  int local_3c [5];
  undefined1 local_28 [8];
  DateTime dateTime;
  TestDateTime_getFraction_NanoSecond *this_local;
  
  dateTime.m_time = (int64_t)this;
  FIX::DateTime::DateTime((DateTime *)local_28);
  FIX::DateTime::setHMS((DateTime *)local_28,1,0,0,0x75bcd15,9);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_3c[1] = 1;
  local_3c[0] = FIX::DateTime::getFraction((DateTime *)local_28,1);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_60,*ppTVar3,0x28);
  UnitTest::CheckEqual<int,int>(pTVar1,local_3c + 1,local_3c,&local_60);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_88[1] = 0xc;
  local_88[0] = FIX::DateTime::getFraction((DateTime *)local_28,2);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_a8,*ppTVar3,0x29);
  UnitTest::CheckEqual<int,int>(pTVar1,local_88 + 1,local_88,&local_a8);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_d0[1] = 0x7b;
  local_d0[0] = FIX::DateTime::getFraction((DateTime *)local_28,3);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_f0,*ppTVar3,0x2a);
  UnitTest::CheckEqual<int,int>(pTVar1,local_d0 + 1,local_d0,&local_f0);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_118[1] = 0x4d2;
  local_118[0] = FIX::DateTime::getFraction((DateTime *)local_28,4);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_138,*ppTVar3,0x2b);
  UnitTest::CheckEqual<int,int>(pTVar1,local_118 + 1,local_118,&local_138);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_160[1] = 0x3039;
  local_160[0] = FIX::DateTime::getFraction((DateTime *)local_28,5);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_180,*ppTVar3,0x2c);
  UnitTest::CheckEqual<int,int>(pTVar1,local_160 + 1,local_160,&local_180);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_1a8[1] = 0x1e240;
  local_1a8[0] = FIX::DateTime::getFraction((DateTime *)local_28,6);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_1c8,*ppTVar3,0x2d);
  UnitTest::CheckEqual<int,int>(pTVar1,local_1a8 + 1,local_1a8,&local_1c8);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_1f0[1] = 0x12d687;
  local_1f0[0] = FIX::DateTime::getFraction((DateTime *)local_28,7);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_210,*ppTVar3,0x2e);
  UnitTest::CheckEqual<int,int>(pTVar1,local_1f0 + 1,local_1f0,&local_210);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_238[1] = 0xbc614e;
  local_238[0] = FIX::DateTime::getFraction((DateTime *)local_28,8);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_258,*ppTVar3,0x2f);
  UnitTest::CheckEqual<int,int>(pTVar1,local_238 + 1,local_238,&local_258);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_280[1] = 0x75bcd15;
  local_280[0] = FIX::DateTime::getFraction((DateTime *)local_28,9);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_2a0,*ppTVar3,0x30);
  UnitTest::CheckEqual<int,int>(pTVar1,local_280 + 1,local_280,&local_2a0);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_2c8[1] = 0x75bcd15;
  local_2c8[0] = FIX::DateTime::getFraction((DateTime *)local_28,0x19);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_2e8,*ppTVar3,0x31);
  UnitTest::CheckEqual<int,int>(pTVar1,local_2c8 + 1,local_2c8,&local_2e8);
  FIX::DateTime::~DateTime((DateTime *)local_28);
  return;
}

Assistant:

TEST(DateTime_getFraction_NanoSecond)
{
  FIX::DateTime dateTime;
  dateTime.setHMS(1,0,0,123456789,9);

  CHECK_EQUAL(1,dateTime.getFraction(1));
  CHECK_EQUAL(12,dateTime.getFraction(2));
  CHECK_EQUAL(123,dateTime.getFraction(3));
  CHECK_EQUAL(1234,dateTime.getFraction(4));
  CHECK_EQUAL(12345,dateTime.getFraction(5));
  CHECK_EQUAL(123456,dateTime.getFraction(6));
  CHECK_EQUAL(1234567,dateTime.getFraction(7));
  CHECK_EQUAL(12345678,dateTime.getFraction(8));
  CHECK_EQUAL(123456789,dateTime.getFraction(9));
  CHECK_EQUAL(123456789,dateTime.getFraction(25));

}